

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O2

pair<unsigned_long,_unsigned_long> __thiscall
google::
dense_hashtable<std::pair<HashObject<4,4>const,int>,HashObject<4,4>,HashFn,google::dense_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SelectKey,google::dense_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SetKey,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>
::find_position<HashObject<4,4>>
          (dense_hashtable<std::pair<HashObject<4,4>const,int>,HashObject<4,4>,HashFn,google::dense_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SelectKey,google::dense_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SetKey,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>
           *this,HashObject<4,_4> *key)

{
  int iVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  pair<unsigned_long,_unsigned_long> pVar6;
  
  g_num_hashes = g_num_hashes + 1;
  uVar4 = (ulong)key->i_;
  uVar2 = 0xffffffffffffffff;
  lVar3 = 1;
  uVar5 = 0xffffffffffffffff;
  while( true ) {
    uVar4 = uVar4 & *(long *)(this + 0x38) - 1U;
    iVar1 = *(int *)(*(long *)(this + 0x48) + uVar4 * 8);
    if (*(int *)(this + 0x24) == iVar1) break;
    if ((*(long *)(this + 0x28) == 0) || (*(int *)(this + 0x20) != iVar1)) {
      if (key->i_ == iVar1) goto LAB_0013bb46;
    }
    else if (uVar5 == 0xffffffffffffffff) {
      uVar5 = uVar4;
    }
    uVar4 = uVar4 + lVar3;
    lVar3 = lVar3 + 1;
  }
  uVar2 = uVar4;
  if (uVar5 != 0xffffffffffffffff) {
    uVar2 = uVar5;
  }
  uVar4 = 0xffffffffffffffff;
LAB_0013bb46:
  pVar6.second = uVar2;
  pVar6.first = uVar4;
  return pVar6;
}

Assistant:

size_type bucket_count() const { return num_buckets; }